

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

void binbuf_eval(_binbuf *x,t_pd *target,int argc,t_atom *argv)

{
  t_float f;
  uint uVar1;
  char *pcVar2;
  t_gpointer *gp;
  char **ppcVar3;
  undefined4 uVar4;
  t_pd *pp_Var5;
  word wVar6;
  t_symbol *ptVar7;
  t_atom *ptVar8;
  int iVar9;
  t_atom *ptVar10;
  long lVar11;
  t_atom tStack_e8;
  bool local_d3;
  bool local_d2;
  bool local_d1;
  t_atom *local_d0;
  t_symbol *local_c8;
  t_symbol *s9;
  t_symbol *s;
  t_pd *nexttarget;
  int j;
  int i;
  t_pd *initial_target;
  int local_98;
  int maxnargs;
  int nargs;
  int ac;
  t_atom *at;
  t_atom *msp;
  t_atom *mstack;
  t_atom smallstack [5];
  t_atom *argv_local;
  t_symbol *ptStack_18;
  int argc_local;
  t_pd *target_local;
  _binbuf *x_local;
  
  ptVar10 = &tStack_e8;
  _nargs = x->b_vec;
  maxnargs = x->b_n;
  initial_target._4_4_ = 0;
  _j = target;
  smallstack[4].a_w = (word)argv;
  ptStack_18 = (t_symbol *)target;
  if (maxnargs < 6) {
    at = (t_atom *)&mstack;
    msp = at;
    ptVar10 = &tStack_e8;
  }
  else {
    iVar9 = maxnargs;
    if (target != &pd_objectmaker) {
      nexttarget._0_4_ = -1;
      if (target != (t_pd *)0x0) {
        nexttarget._0_4_ = 0;
      }
      for (nexttarget._4_4_ = 0; iVar9 = initial_target._4_4_, nexttarget._4_4_ < maxnargs;
          nexttarget._4_4_ = nexttarget._4_4_ + 1) {
        if (_nargs[nexttarget._4_4_].a_type == A_SEMI) {
          nexttarget._0_4_ = -1;
        }
        else if (_nargs[nexttarget._4_4_].a_type == A_COMMA) {
          nexttarget._0_4_ = 0;
        }
        else {
          nexttarget._0_4_ = (int)nexttarget + 1;
          if (initial_target._4_4_ < (int)nexttarget) {
            initial_target._4_4_ = (int)nexttarget;
          }
        }
      }
    }
    initial_target._4_4_ = iVar9;
    if (initial_target._4_4_ < 6) {
      at = (t_atom *)&mstack;
      msp = at;
      ptVar10 = &tStack_e8;
    }
    else {
      if (initial_target._4_4_ < 1000) {
        ptVar10 = &tStack_e8 + -(long)initial_target._4_4_;
        local_d0 = ptVar10;
      }
      else {
        local_d0 = (t_atom *)getbytes((long)initial_target._4_4_ << 4);
      }
      msp = local_d0;
      at = msp;
    }
  }
  do {
    while (wVar6 = smallstack[4].a_w, pp_Var5 = _j, ptStack_18 == (t_symbol *)0x0) {
      while( true ) {
        ptVar8 = _nargs;
        local_d1 = false;
        if (maxnargs != 0) {
          local_d2 = true;
          if (_nargs->a_type != A_SEMI) {
            local_d2 = _nargs->a_type == A_COMMA;
          }
          local_d1 = local_d2;
        }
        if (local_d1 == false) break;
        maxnargs = maxnargs + -1;
        _nargs = _nargs + 1;
      }
      if (maxnargs == 0) break;
      if (_nargs->a_type == A_DOLLAR) {
        if (((_nargs->a_w).w_index < 1) || (argc < (_nargs->a_w).w_index)) {
          uVar1 = (_nargs->a_w).w_index;
          *(undefined8 *)((long)ptVar10 + -8) = 0x199548;
          pd_error(pp_Var5,"$%d: not enough arguments supplied",(ulong)uVar1);
        }
        else {
          if (*(int *)(&(smallstack[4].a_w.w_symbol)->s_name +
                      (long)((_nargs->a_w).w_index + -1) * 2) == 2) {
            s9 = (t_symbol *)
                 (&(smallstack[4].a_w.w_symbol)->s_thing)[(long)((_nargs->a_w).w_index + -1) * 2];
            goto LAB_00199629;
          }
          uVar1 = (_nargs->a_w).w_index;
          *(undefined8 *)((long)ptVar10 + -8) = 0x19958c;
          pd_error(pp_Var5,"$%d: symbol needed as message destination",(ulong)uVar1);
        }
      }
      else {
        if (_nargs->a_type == A_DOLLSYM) {
          ptVar7 = (_nargs->a_w).w_symbol;
          *(undefined8 *)((long)ptVar10 + -8) = 0x1995e0;
          s9 = binbuf_realizedollsym(ptVar7,argc,wVar6.w_symbol,0);
          pp_Var5 = _j;
          if (s9 == (t_symbol *)0x0) {
            pcVar2 = ((_nargs->a_w).w_symbol)->s_name;
            *(undefined8 *)((long)ptVar10 + -8) = 0x199610;
            pd_error(pp_Var5,"$%s: not enough arguments supplied",pcVar2);
            goto LAB_0019965f;
          }
        }
        else {
          *(undefined8 *)((long)ptVar10 + -8) = 0x199620;
          s9 = atom_getsymbol(ptVar8);
        }
LAB_00199629:
        pp_Var5 = _j;
        ptStack_18 = (t_symbol *)s9->s_thing;
        if (ptStack_18 != (t_symbol *)0x0) {
          _nargs = _nargs + 1;
          maxnargs = maxnargs + -1;
          break;
        }
        pcVar2 = s9->s_name;
        *(undefined8 *)((long)ptVar10 + -8) = 0x19965d;
        pd_error(pp_Var5,"%s: no such object ",pcVar2);
      }
LAB_0019965f:
      do {
        _nargs = _nargs + 1;
        maxnargs = maxnargs + -1;
        local_d3 = false;
        if (maxnargs != 0) {
          local_d3 = _nargs->a_type != A_SEMI;
        }
      } while (local_d3 != false);
    }
    if (maxnargs == 0) {
LAB_00199ab6:
      ptVar8 = msp;
      if ((5 < initial_target._4_4_) && (tStack_e8.a_type._3_1_ = 1, 999 < initial_target._4_4_)) {
        lVar11 = (long)initial_target._4_4_;
        *(undefined8 *)((long)ptVar10 + -8) = 0x199ae7;
        freebytes(ptVar8,lVar11 << 4);
      }
      return;
    }
    local_98 = 0;
    s = ptStack_18;
    for (; wVar6 = smallstack[4].a_w, ptVar8 = msp, iVar9 = local_98, maxnargs != 0;
        maxnargs = maxnargs + -1) {
      tStack_e8.a_w._4_4_ = 0;
      tStack_e8.a_w.w_index = _nargs->a_type - A_FLOAT;
      switch(tStack_e8.a_w) {
      case (word)0x0:
      case (word)0x1:
        uVar4 = *(undefined4 *)&_nargs->field_0x4;
        at->a_type = _nargs->a_type;
        *(undefined4 *)&at->field_0x4 = uVar4;
        at->a_w = _nargs->a_w;
        break;
      default:
        *(undefined8 *)((long)ptVar10 + -8) = 0x19994e;
        bug("bad item in binbuf");
        goto LAB_00199ab6;
      case (word)0x3:
        if (ptStack_18 != (t_symbol *)&pd_objectmaker) {
          s = (t_symbol *)0x0;
          goto LAB_00199994;
        }
        at->a_type = A_SYMBOL;
        *(undefined8 *)((long)ptVar10 + -8) = 0x19975c;
        ptVar7 = gensym(";");
        (at->a_w).w_symbol = ptVar7;
        break;
      case (word)0x4:
        if (ptStack_18 != (t_symbol *)&pd_objectmaker) goto LAB_00199994;
        at->a_type = A_SYMBOL;
        *(undefined8 *)((long)ptVar10 + -8) = 0x19979f;
        ptVar7 = gensym(",");
        (at->a_w).w_symbol = ptVar7;
        break;
      case (word)0x7:
        if (((_nargs->a_w).w_index < 1) || (argc < (_nargs->a_w).w_index)) {
          if ((_nargs->a_w).w_index == 0) {
            at->a_type = A_FLOAT;
            *(undefined8 *)((long)ptVar10 + -8) = 0x19983c;
            iVar9 = canvas_getdollarzero();
            (at->a_w).w_float = (float)iVar9;
          }
          else if (ptStack_18 == (t_symbol *)&pd_objectmaker) {
            at->a_type = A_FLOAT;
            (at->a_w).w_float = 0.0;
          }
          else {
            uVar1 = (_nargs->a_w).w_index;
            *(undefined8 *)((long)ptVar10 + -8) = 0x19988c;
            pd_error(ptStack_18,"$%d: argument number out of range",(ulong)uVar1);
            at->a_type = A_FLOAT;
            (at->a_w).w_float = 0.0;
          }
        }
        else {
          iVar9 = (_nargs->a_w).w_index;
          ppcVar3 = &(smallstack[4].a_w.w_symbol)->s_name;
          *(char **)at = ppcVar3[(long)(iVar9 + -1) * 2];
          at->a_w = *(word *)(ppcVar3 + (long)(iVar9 + -1) * 2 + 1);
        }
        break;
      case (word)0x8:
        ptVar7 = (_nargs->a_w).w_symbol;
        *(undefined8 *)((long)ptVar10 + -8) = 0x1998d5;
        local_c8 = binbuf_realizedollsym
                             (ptVar7,argc,wVar6.w_symbol,
                              (uint)(ptStack_18 == (t_symbol *)&pd_objectmaker));
        if (local_c8 == (t_symbol *)0x0) {
          pcVar2 = ((_nargs->a_w).w_symbol)->s_name;
          *(undefined8 *)((long)ptVar10 + -8) = 0x199906;
          pd_error(ptStack_18,"%s: argument number out of range",pcVar2);
          at->a_type = A_SYMBOL;
          at->a_w = _nargs->a_w;
        }
        else {
          at->a_type = A_SYMBOL;
          (at->a_w).w_symbol = local_c8;
        }
      }
      at = at + 1;
      _nargs = _nargs + 1;
      local_98 = local_98 + 1;
    }
LAB_00199994:
    if (local_98 != 0) {
      tStack_e8._4_4_ = msp->a_type;
      if (tStack_e8._4_4_ == A_FLOAT) {
        if (local_98 == 1) {
          f = (msp->a_w).w_float;
          *(undefined8 *)((long)ptVar10 + -8) = 0x199a10;
          pd_float((t_pd *)ptStack_18,f);
        }
        else {
          *(undefined8 *)((long)ptVar10 + -8) = 0x199a29;
          pd_list((t_pd *)ptStack_18,(t_symbol *)0x0,iVar9,ptVar8);
        }
      }
      else if (tStack_e8._4_4_ == A_SYMBOL) {
        ptVar7 = (msp->a_w).w_symbol;
        iVar9 = local_98 + -1;
        ptVar8 = msp + 1;
        *(undefined8 *)((long)ptVar10 + -8) = 0x1999f3;
        pd_typedmess((t_pd *)ptStack_18,ptVar7,iVar9,ptVar8);
      }
      else if (tStack_e8._4_4_ == A_POINTER) {
        if (local_98 == 1) {
          gp = (msp->a_w).w_gpointer;
          *(undefined8 *)((long)ptVar10 + -8) = 0x199a45;
          pd_pointer((t_pd *)ptStack_18,gp);
        }
        else {
          *(undefined8 *)((long)ptVar10 + -8) = 0x199a5e;
          pd_list((t_pd *)ptStack_18,(t_symbol *)0x0,iVar9,ptVar8);
        }
      }
      else {
        *(undefined8 *)((long)ptVar10 + -8) = 0x199a6e;
        bug("bad selector");
      }
    }
    at = msp;
    if (maxnargs == 0) goto LAB_00199ab6;
    ptStack_18 = s;
    _nargs = _nargs + 1;
    maxnargs = maxnargs + -1;
  } while( true );
}

Assistant:

void binbuf_eval(const t_binbuf *x, t_pd *target, int argc, const t_atom *argv)
{
    t_atom smallstack[SMALLMSG], *mstack, *msp;
    const t_atom *at = x->b_vec;
    int ac = x->b_n;
    int nargs, maxnargs = 0;
    t_pd *initial_target = target;

    if (ac <= SMALLMSG)
        mstack = smallstack;
    else
    {
#if 1
            /* count number of args in biggest message.  The weird
            treatment of "pd_objectmaker" is because when the message
            goes out to objectmaker, commas and semis are passed
            on as regular args (see below).  We're tacitly assuming here
            that the pd_objectmaker target can't come up via a named
            destination in the message, only because the original "target"
            points there. */
        if (target == &pd_objectmaker)
            maxnargs = ac;
        else
        {
            int i, j = (target ? 0 : -1);
            for (i = 0; i < ac; i++)
            {
                if (at[i].a_type == A_SEMI)
                    j = -1;
                else if (at[i].a_type == A_COMMA)
                    j = 0;
                else if (++j > maxnargs)
                    maxnargs = j;
            }
        }
        if (maxnargs <= SMALLMSG)
            mstack = smallstack;
        else ATOMS_ALLOCA(mstack, maxnargs);
#else
            /* just pessimistically allocate enough to hold everything
            at once.  This turned out to run slower in a simple benchmark
            I tried, perhaps because the extra memory allocation
            hurt the cache hit rate. */
        maxnargs = ac;
        ATOMS_ALLOCA(mstack, maxnargs);
#endif

    }
    msp = mstack;
    while (1)
    {
        t_pd *nexttarget;
            /* get a target. */
        while (!target)
        {
            t_symbol *s;
            while (ac && (at->a_type == A_SEMI || at->a_type == A_COMMA))
                ac--,  at++;
            if (!ac) break;
            if (at->a_type == A_DOLLAR)
            {
                if (at->a_w.w_index <= 0 || at->a_w.w_index > argc)
                {
                    pd_error(initial_target, "$%d: not enough arguments supplied",
                            at->a_w.w_index);
                    goto cleanup;
                }
                else if (argv[at->a_w.w_index-1].a_type != A_SYMBOL)
                {
                    pd_error(initial_target, "$%d: symbol needed as message destination",
                        at->a_w.w_index);
                    goto cleanup;
                }
                else s = argv[at->a_w.w_index-1].a_w.w_symbol;
            }
            else if (at->a_type == A_DOLLSYM)
            {
                if (!(s = binbuf_realizedollsym(at->a_w.w_symbol,
                    argc, argv, 0)))
                {
                    pd_error(initial_target, "$%s: not enough arguments supplied",
                        at->a_w.w_symbol->s_name);
                    goto cleanup;
                }
            }
            else s = atom_getsymbol(at);
            if (!(target = s->s_thing))
            {
                pd_error(initial_target, "%s: no such object ", s->s_name);
            cleanup:
                do at++, ac--;
                while (ac && at->a_type != A_SEMI);
                    /* LATER eat args until semicolon and continue */
                continue;
            }
            else
            {
                at++, ac--;
                break;
            }
        }
        if (!ac) break;
        nargs = 0;
        nexttarget = target;
        while (1)
        {
            t_symbol *s9;
            if (!ac) goto gotmess;
            switch (at->a_type)
            {
            case A_SEMI:
                    /* semis and commas in new message just get bashed to
                    a symbol.  This is needed so you can pass them to "expr." */
                if (target == &pd_objectmaker)
                {
                    SETSYMBOL(msp, gensym(";"));
                    break;
                }
                else
                {
                    nexttarget = 0;
                    goto gotmess;
                }
            case A_COMMA:
                if (target == &pd_objectmaker)
                {
                    SETSYMBOL(msp, gensym(","));
                    break;
                }
                else goto gotmess;
            case A_FLOAT:
            case A_SYMBOL:
                *msp = *at;
                break;
            case A_DOLLAR:
                if (at->a_w.w_index > 0 && at->a_w.w_index <= argc)
                    *msp = argv[at->a_w.w_index-1];
                else if (at->a_w.w_index == 0)
                    SETFLOAT(msp, canvas_getdollarzero());
                else
                {
                    if (target == &pd_objectmaker)
                        SETFLOAT(msp, 0);
                    else
                    {
                        pd_error(target, "$%d: argument number out of range",
                            at->a_w.w_index);
                        SETFLOAT(msp, 0);
                    }
                }
                break;
            case A_DOLLSYM:
                s9 = binbuf_realizedollsym(at->a_w.w_symbol, argc, argv,
                    target == &pd_objectmaker);
                if (!s9)
                {
                    pd_error(target, "%s: argument number out of range", at->a_w.w_symbol->s_name);
                    SETSYMBOL(msp, at->a_w.w_symbol);
                }
                else SETSYMBOL(msp, s9);
                break;
            default:
                bug("bad item in binbuf");
                goto broken;
            }
            msp++;
            ac--;
            at++;
            nargs++;
        }
    gotmess:
        if (nargs)
        {
            switch (mstack->a_type)
            {
            case A_SYMBOL:
                typedmess(target, mstack->a_w.w_symbol, nargs-1, mstack+1);
                break;
            case A_FLOAT:
                if (nargs == 1) pd_float(target, mstack->a_w.w_float);
                else pd_list(target, 0, nargs, mstack);
                break;
            case A_POINTER:
                if (nargs == 1) pd_pointer(target, mstack->a_w.w_gpointer);
                else pd_list(target, 0, nargs, mstack);
                break;
            default:
                bug("bad selector");
                break;
            }
        }
        msp = mstack;
        if (!ac) break;
        target = nexttarget;
        at++;
        ac--;
    }
broken:
    if (maxnargs > SMALLMSG)
         ATOMS_FREEA(mstack, maxnargs);
}